

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O2

void DiscardPriorPreloaded(CP_Services Svcs,Evpath_RS_Stream RS_Stream,size_t Timestep)

{
  char *block;
  CP_VerboseFunc p_Var1;
  void *pvVar2;
  size_t sVar3;
  _RSTimestepEntry **pp_Var4;
  CManager p_Var5;
  uint64_t uVar6;
  RSTimestepList ItemToFree;
  _RSTimestepEntry *__ptr;
  _RSTimestepEntry *p_Var7;
  bool bVar8;
  
  p_Var7 = RS_Stream->QueuedTimesteps;
  __ptr = (_RSTimestepEntry *)0x0;
  do {
    pp_Var4 = &__ptr->Next;
    bVar8 = __ptr == (_RSTimestepEntry *)0x0;
    __ptr = p_Var7;
    if (bVar8) {
      pp_Var4 = &RS_Stream->QueuedTimesteps;
    }
    while( true ) {
      if (__ptr == (_RSTimestepEntry *)0x0) {
        return;
      }
      p_Var7 = __ptr->Next;
      if (Timestep <= __ptr->Timestep) break;
      p_Var5 = (*Svcs->getCManager)(RS_Stream->CP_Stream);
      *pp_Var4 = __ptr->Next;
      block = __ptr->Data;
      if (block != (char *)0x0) {
        p_Var1 = Svcs->verbose;
        pvVar2 = RS_Stream->CP_Stream;
        sVar3 = __ptr->Timestep;
        uVar6 = writeBlockFingerprint(block,__ptr->DataSize);
        (*p_Var1)(pvVar2,4,"Discarding prior, TS %ld, data %p, fprint %lx\n",sVar3,block,uVar6);
        CMreturn_buffer(p_Var5,__ptr->Data);
      }
      free(__ptr);
      __ptr = p_Var7;
    }
  } while( true );
}

Assistant:

static void DiscardPriorPreloaded(CP_Services Svcs, Evpath_RS_Stream RS_Stream, size_t Timestep)
{
    RSTimestepList Entry, Last = NULL;
    Entry = RS_Stream->QueuedTimesteps;

    while (Entry)
    {
        RSTimestepList Next = Entry->Next;
        if (Entry->Timestep < Timestep)
        {
            RSTimestepList ItemToFree = Entry;
            CManager cm = Svcs->getCManager(RS_Stream->CP_Stream);
            if (Last)
            {
                Last->Next = Entry->Next;
            }
            else
            {
                RS_Stream->QueuedTimesteps = Entry->Next;
            }
            /* free item */
            if (ItemToFree->Data)
            {
                Svcs->verbose(RS_Stream->CP_Stream, DPPerRankVerbose,
                              "Discarding prior, TS %ld, data %p, fprint %lx\n",
                              ItemToFree->Timestep, ItemToFree->Data,
                              writeBlockFingerprint(ItemToFree->Data, ItemToFree->DataSize));
                CMreturn_buffer(cm, ItemToFree->Data);
            }

            free(ItemToFree);
        }
        else
        {
            Last = Entry;
        }
        Entry = Next;
    }
}